

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O3

QObject * __thiscall QFactoryLoader::instanceHelper_locked(QFactoryLoader *this,int index)

{
  QList<QObject_*(*)()> *this_00;
  pointer puVar1;
  __uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter> this_01;
  qsizetype qVar2;
  _func_QObject_ptr *p_Var3;
  bool bVar4;
  Result RVar5;
  QCborError QVar6;
  pointer pbVar7;
  QObject *pQVar8;
  long lVar9;
  pointer pp_Var10;
  ulong uVar11;
  undefined8 *puVar12;
  long lVar13;
  QtPluginMetaDataKeys key;
  ulong uVar14;
  long in_FS_OFFSET;
  char *local_f0;
  QByteArray local_a8;
  QByteArray local_88;
  QFactoryLoaderIidSearch local_70;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = (ulong)index;
  puVar1 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(this->d).libraries.
                 super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (uVar11 < uVar14) {
    this_01._M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
    super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl =
         puVar1[uVar11]._M_t.super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>._M_t;
    pbVar7 = QList<bool>::data(&(this->d).loadedLibraries);
    pbVar7[uVar11] = true;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar8 = QLibraryPrivate::pluginInstance
                         ((QLibraryPrivate *)
                          this_01._M_t.
                          super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                          super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl);
      return pQVar8;
    }
  }
  else {
    local_f0 = (this->d).iid.d.ptr;
    if (local_f0 == (char *)0x0) {
      local_f0 = &QByteArray::_empty;
    }
    qVar2 = (this->d).iid.d.size;
    QPluginLoader::staticPlugins();
    puVar12 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
    lVar9 = (long)(index - (int)uVar14);
    lVar13 = 0;
    do {
      p_Var3 = (_func_QObject_ptr *)*puVar12;
      local_70._16_8_ = 0xaaaaaaaaaaaaaa00;
      local_70.iid.m_data = local_f0;
      local_70.iid.m_size = qVar2;
      if ((*(byte *)puVar12[2] & 0xfe) == 0) {
        local_88.d.ptr = (char *)((byte *)puVar12[2] + 4);
        local_88.d.size = puVar12[1] + -4;
        local_88.d.d = (Data *)0x0;
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCborStreamReader::QCborStreamReader((QCborStreamReader *)local_58,&local_88);
        if (local_58[0x10] == 0xa0) {
          bVar4 = QCborStreamReader::_enterContainer_helper((QCborStreamReader *)local_58);
          if (bVar4) {
            do {
              if (local_58[0x10] == 0xff) {
                bVar4 = QCborStreamReader::leaveContainer((QCborStreamReader *)local_58);
                if (!bVar4) break;
                goto LAB_002d5a86;
              }
              if (local_58[0x10] < 0x21) {
                uVar11 = -(ulong)(local_58[0x10] == 0x20) ^ local_58._0_8_;
                key = (QtPluginMetaDataKeys)uVar11;
                if ((long)(int)key != uVar11) goto LAB_002d5a86;
                bVar4 = QCborStreamReader::next((QCborStreamReader *)local_58,10000);
                if (!bVar4) {
                  QCborStreamReader::lastError((QCborStreamReader *)local_58);
                  goto LAB_002d5a86;
                }
                RVar5 = anon_unknown.dwarf_9a8673::QFactoryLoaderIidSearch::operator()
                                  (&local_70,key,(QCborStreamReader *)local_58);
              }
              else {
                if (local_58[0x10] != 0x60) goto LAB_002d5a86;
                local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                QCborStreamReader::readAllUtf8String(&local_a8,(QCborStreamReader *)local_58);
                bVar4 = QByteArray::isNull(&local_a8);
                if (bVar4) {
                  RVar5 = 0xaaaaaaaa;
                  QCborStreamReader::lastError((QCborStreamReader *)local_58);
                }
                else {
                  RVar5 = ContinueSearch;
                  QCborStreamReader::next((QCborStreamReader *)local_58,10000);
                }
                if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if (bVar4) goto LAB_002d5a86;
              }
              QVar6 = QCborStreamReader::lastError((QCborStreamReader *)local_58);
              if ((RVar5 != ContinueSearch) || (QVar6.c != NoError)) goto LAB_002d5a86;
            } while( true );
          }
LAB_002d5a7e:
          QCborStreamReader::lastError((QCborStreamReader *)local_58);
        }
        else if (local_58[0x10] == 0xff) goto LAB_002d5a7e;
LAB_002d5a86:
        QCborStreamReader::~QCborStreamReader((QCborStreamReader *)local_58);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((local_70._16_8_ & 1) != 0) {
          if (lVar13 == lVar9) {
            this_00 = &(this->d).usedStaticInstances;
            if ((this->d).usedStaticInstances.d.size <= lVar9) {
              QList<QObject_*(*)()>::resize(this_00,lVar9 + 1);
            }
            pp_Var10 = QList<QObject_*(*)()>::data(this_00);
            pp_Var10[lVar9] = p_Var3;
            pQVar8 = (*p_Var3)();
            goto LAB_002d5b20;
          }
          lVar13 = lVar13 + 1;
        }
      }
      puVar12 = puVar12 + 3;
    } while (puVar12 != (undefined8 *)0xaaaaaaaaaaaaaa9a);
    pQVar8 = (QObject *)0x0;
LAB_002d5b20:
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return pQVar8;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline QObject *QFactoryLoader::instanceHelper_locked(int index) const
{
#if QT_CONFIG(library)
    if (size_t(index) < d->libraries.size()) {
        QLibraryPrivate *library = d->libraries[index].get();
        d->loadedLibraries[index] = true;
        return library->pluginInstance();
    }
    // we know d->libraries.size() <= index <= numeric_limits<decltype(index)>::max() → no overflow
    index -= static_cast<int>(d->libraries.size());
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const QList<QStaticPlugin> staticPlugins = QPluginLoader::staticPlugins();
    qsizetype i = 0;
    for (QStaticPlugin plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData), plugin.rawMetaDataSize);
        if (!isIidMatch(pluginData, iid))
            continue;

        if (i == index) {
            if (d->usedStaticInstances.size() <= i)
                d->usedStaticInstances.resize(i + 1);
            d->usedStaticInstances[i] = plugin.instance;
            return plugin.instance();
        }
        ++i;
    }

    return nullptr;
}